

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O1

void Wln_NtkToNdrTest(Wln_Ntk_t *p)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  bool bVar5;
  uint uVar6;
  Ndr_Data_t *p_00;
  void *__ptr;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  void *pvVar10;
  uint *puVar11;
  uint *puVar12;
  FILE *pFVar13;
  int Obj;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  long lVar17;
  int Ent;
  int iVar18;
  int iVar19;
  undefined8 uVar20;
  uint uVar21;
  uint uVar22;
  int Ent_2;
  int iVar23;
  ulong uVar24;
  int Ent_3;
  int iVar25;
  Ndr_Data_t *p_1;
  
  p_00 = (Ndr_Data_t *)Wln_NtkToNdr(p);
  lVar17 = (long)(p->vTypes).nSize;
  __ptr = malloc(lVar17 * 8 + 8);
  if (1 < lVar17) {
    lVar17 = 1;
    do {
      pcVar7 = Wln_ObjName(p,(int)lVar17);
      if (pcVar7 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar7);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar7);
      }
      *(char **)((long)__ptr + lVar17 * 8) = pcVar9;
      lVar17 = lVar17 + 1;
    } while (lVar17 < (p->vTypes).nSize);
  }
  pFVar13 = _stdout;
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar11 = p_00->pBody;
    if (1 < (int)*puVar11) {
      iVar15 = 1;
      do {
        puVar4 = p_00->pHead;
        if (puVar4[iVar15] == '\x02') {
          Obj = iVar15 + 1;
          iVar23 = puVar11[iVar15] + iVar15;
          if (Obj < iVar23) {
            iVar25 = 0;
            iVar14 = Obj;
            do {
              bVar1 = puVar4[iVar14];
              if (bVar1 == 3) {
                for (iVar19 = iVar14 + 1; uVar6 = 1, iVar19 < (int)(puVar11[iVar14] + iVar14);
                    iVar19 = iVar19 + uVar6) {
                  bVar2 = puVar4[iVar19];
                  if (bVar2 == 6) {
                    uVar6 = (uint)(puVar11[iVar19] == 4);
                    break;
                  }
                  if (bVar2 == 0) goto LAB_0035d8eb;
                  uVar6 = 1;
                  if (bVar2 < 4) {
                    uVar6 = puVar11[iVar19];
                  }
                }
                iVar25 = iVar25 + uVar6;
              }
              else if (bVar1 == 0) goto LAB_0035d8eb;
              uVar6 = 1;
              if (bVar1 < 4) {
                uVar6 = puVar11[iVar14];
              }
              iVar14 = iVar14 + uVar6;
            } while (iVar14 < iVar23);
            sVar8 = (long)iVar25 << 2;
          }
          else {
            sVar8 = 0;
          }
          pvVar10 = malloc(sVar8);
          lVar17 = -1;
          for (iVar14 = Obj; iVar14 < iVar23; iVar14 = iVar14 + uVar6) {
            bVar1 = puVar4[iVar14];
            if (bVar1 == 7) {
              lVar17 = (long)(int)puVar11[iVar14];
              break;
            }
            if (bVar1 == 0) goto LAB_0035d8eb;
            uVar6 = 1;
            if (bVar1 < 4) {
              uVar6 = puVar11[iVar14];
            }
          }
          fprintf(pFVar13,"\nmodule %s (\n  ",*(undefined8 *)((long)__ptr + lVar17 * 8));
          puVar11 = p_00->pBody;
          iVar23 = Obj;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
            do {
              puVar4 = p_00->pHead;
              if (puVar4[iVar23] == '\x03') {
                iVar25 = iVar23 + 1;
                iVar19 = puVar11[iVar23] + iVar23;
                lVar17 = -1;
                iVar14 = iVar25;
                if (iVar25 < iVar19) {
                  do {
                    bVar1 = puVar4[iVar14];
                    if (bVar1 == 6) {
                      if (puVar11[iVar14] != 3) goto LAB_0035bf82;
                      break;
                    }
                    if (bVar1 == 0) goto LAB_0035d8eb;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar11[iVar14];
                    }
                    iVar14 = iVar14 + uVar6;
                  } while (iVar14 < iVar19);
                  do {
                    if (iVar19 <= iVar25) break;
                    bVar1 = puVar4[iVar25];
                    if (bVar1 == 5) {
                      lVar17 = (long)(int)puVar11[iVar25];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_0035d8eb;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar11[iVar25];
                    }
                    iVar25 = iVar25 + uVar6;
                  } while( true );
                }
                fprintf(pFVar13,"%s, ",*(undefined8 *)((long)__ptr + lVar17 * 8));
              }
              else if (puVar4[iVar23] == '\0') goto LAB_0035d8eb;
LAB_0035bf82:
              if (p_00->pHead[iVar23] == 0) goto LAB_0035d8eb;
              uVar6 = 1;
              if (p_00->pHead[iVar23] < 4) {
                uVar6 = p_00->pBody[iVar23];
              }
              iVar23 = iVar23 + uVar6;
              puVar11 = p_00->pBody;
            } while (iVar23 < (int)(puVar11[iVar15] + iVar15));
          }
          fwrite("\n  ",3,1,pFVar13);
          puVar11 = p_00->pBody;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
            bVar5 = true;
            iVar23 = Obj;
            do {
              puVar4 = p_00->pHead;
              if (puVar4[iVar23] == '\x03') {
                iVar25 = iVar23 + 1;
                for (iVar14 = iVar25; iVar14 < (int)(puVar11[iVar23] + iVar23);
                    iVar14 = iVar14 + uVar6) {
                  bVar1 = puVar4[iVar14];
                  if (bVar1 == 6) {
                    if (puVar11[iVar14] != 4) goto LAB_0035c0d5;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_0035d8eb;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar11[iVar14];
                  }
                }
                pcVar7 = "T = %d\t\t";
                if (!bVar5) {
                  pcVar7 = "    \"%s\", ";
                }
                lVar17 = -1;
                for (; iVar25 < (int)(puVar11[iVar23] + iVar23); iVar25 = iVar25 + uVar6) {
                  bVar1 = puVar4[iVar25];
                  if (bVar1 == 4) {
                    lVar17 = (long)(int)puVar11[iVar25];
                    break;
                  }
                  if (bVar1 == 0) goto LAB_0035d8eb;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar11[iVar25];
                  }
                }
                bVar5 = false;
                fprintf(pFVar13,"%s%s",pcVar7 + 8,*(undefined8 *)((long)__ptr + lVar17 * 8));
              }
              else if (puVar4[iVar23] == '\0') goto LAB_0035d8eb;
LAB_0035c0d5:
              if (p_00->pHead[iVar23] == 0) goto LAB_0035d8eb;
              uVar6 = 1;
              if (p_00->pHead[iVar23] < 4) {
                uVar6 = p_00->pBody[iVar23];
              }
              iVar23 = iVar23 + uVar6;
              puVar11 = p_00->pBody;
            } while (iVar23 < (int)(puVar11[iVar15] + iVar15));
          }
          fwrite("\n);\n\n",5,1,pFVar13);
          puVar11 = p_00->pBody;
          iVar23 = Obj;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
            do {
              uVar3 = p_00->pHead[iVar23];
              if (uVar3 == '\x03') {
                iVar25 = iVar23 + 1;
                for (iVar14 = iVar25; iVar14 < (int)(puVar11[iVar23] + iVar23);
                    iVar14 = iVar14 + uVar6) {
                  bVar1 = p_00->pHead[iVar14];
                  if (bVar1 == 6) {
                    if (puVar11[iVar14] != 3) goto LAB_0035c237;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_0035d8eb;
                  uVar6 = 1;
                  if (bVar1 < 4) {
                    uVar6 = puVar11[iVar14];
                  }
                }
                fwrite("  input ",8,1,pFVar13);
                Ndr_ObjWriteRange(p_00,iVar23,(FILE *)pFVar13,1);
                puVar11 = p_00->pBody;
                lVar17 = -1;
                if (iVar25 < (int)(puVar11[iVar23] + iVar23)) {
                  do {
                    bVar1 = p_00->pHead[iVar25];
                    if (bVar1 == 5) {
                      lVar17 = (long)(int)puVar11[iVar25];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_0035d8eb;
                    uVar6 = 1;
                    if (bVar1 < 4) {
                      uVar6 = puVar11[iVar25];
                    }
                    iVar25 = iVar25 + uVar6;
                  } while (iVar25 < (int)(puVar11[iVar23] + iVar23));
                }
                fprintf(pFVar13," %s;\n",*(undefined8 *)((long)__ptr + lVar17 * 8));
              }
              else if (uVar3 == '\0') goto LAB_0035d8eb;
LAB_0035c237:
              if (p_00->pHead[iVar23] == 0) goto LAB_0035d8eb;
              uVar6 = 1;
              if (p_00->pHead[iVar23] < 4) {
                uVar6 = p_00->pBody[iVar23];
              }
              iVar23 = iVar23 + uVar6;
              puVar11 = p_00->pBody;
            } while (iVar23 < (int)(puVar11[iVar15] + iVar15));
          }
          puVar11 = p_00->pBody;
          uVar6 = 0;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
            uVar6 = 0;
            iVar23 = Obj;
            do {
              uVar3 = p_00->pHead[iVar23];
              if (uVar3 == '\x03') {
                iVar25 = iVar23 + 1;
                for (iVar14 = iVar25; iVar14 < (int)(puVar11[iVar23] + iVar23);
                    iVar14 = iVar14 + uVar22) {
                  bVar1 = p_00->pHead[iVar14];
                  if (bVar1 == 6) {
                    if (puVar11[iVar14] != 4) goto LAB_0035c3f1;
                    break;
                  }
                  if (bVar1 == 0) goto LAB_0035d8eb;
                  uVar22 = 1;
                  if (bVar1 < 4) {
                    uVar22 = puVar11[iVar14];
                  }
                }
                fwrite("  output ",9,1,pFVar13);
                Ndr_ObjWriteRange(p_00,iVar23,(FILE *)pFVar13,1);
                puVar11 = p_00->pBody;
                lVar17 = -1;
                if (iVar25 < (int)(puVar11[iVar23] + iVar23)) {
                  iVar14 = iVar25;
                  do {
                    bVar1 = p_00->pHead[iVar14];
                    if (bVar1 == 4) {
                      lVar17 = (long)(int)puVar11[iVar14];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_0035d8eb;
                    uVar22 = 1;
                    if (bVar1 < 4) {
                      uVar22 = puVar11[iVar14];
                    }
                    iVar14 = iVar14 + uVar22;
                  } while (iVar14 < (int)(puVar11[iVar23] + iVar23));
                }
                fprintf(pFVar13," %s;\n",*(undefined8 *)((long)__ptr + lVar17 * 8));
                puVar11 = p_00->pBody;
                uVar22 = 0xffffffff;
                if (iVar25 < (int)(puVar11[iVar23] + iVar23)) {
                  do {
                    bVar1 = p_00->pHead[iVar25];
                    if (bVar1 == 4) {
                      uVar22 = puVar11[iVar25];
                      break;
                    }
                    if (bVar1 == 0) goto LAB_0035d8eb;
                    uVar21 = 1;
                    if (bVar1 < 4) {
                      uVar21 = puVar11[iVar25];
                    }
                    iVar25 = iVar25 + uVar21;
                  } while (iVar25 < (int)(puVar11[iVar23] + iVar23));
                }
                lVar17 = (long)(int)uVar6;
                uVar6 = uVar6 + 1;
                *(uint *)((long)pvVar10 + lVar17 * 4) = uVar22;
              }
              else if (uVar3 == '\0') goto LAB_0035d8eb;
LAB_0035c3f1:
              if (p_00->pHead[iVar23] == 0) goto LAB_0035d8eb;
              uVar22 = 1;
              if (p_00->pHead[iVar23] < 4) {
                uVar22 = p_00->pBody[iVar23];
              }
              iVar23 = iVar23 + uVar22;
              puVar11 = p_00->pBody;
            } while (iVar23 < (int)(puVar11[iVar15] + iVar15));
          }
          fputc(10,pFVar13);
          puVar11 = p_00->pBody;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
            iVar23 = Obj;
LAB_0035c455:
            puVar4 = p_00->pHead;
            if (puVar4[iVar23] == '\x03') {
              iVar25 = puVar11[iVar23] + iVar23;
              iVar19 = iVar23 + 1;
              for (iVar14 = iVar19; iVar14 < iVar25; iVar14 = iVar14 + uVar22) {
                bVar1 = puVar4[iVar14];
                if (bVar1 == 6) {
                  if ((iVar19 < iVar25) && (iVar18 = iVar19, puVar11[iVar14] != 3))
                  goto LAB_0035c4d0;
                  break;
                }
                if (bVar1 == 0) goto LAB_0035d8eb;
                uVar22 = 1;
                if (bVar1 < 4) {
                  uVar22 = puVar11[iVar14];
                }
              }
              goto LAB_0035c614;
            }
            if (puVar4[iVar23] == '\0') goto LAB_0035d8eb;
            goto LAB_0035c614;
          }
LAB_0035c649:
          free(pvVar10);
          fputc(10,pFVar13);
          puVar11 = p_00->pBody;
          if (Obj < (int)(puVar11[iVar15] + iVar15)) {
LAB_0035c67b:
            puVar4 = p_00->pHead;
            if (puVar4[Obj] == '\x03') {
              iVar14 = puVar11[Obj] + Obj;
              iVar25 = Obj + 1;
              for (iVar23 = iVar25; iVar23 < iVar14; iVar23 = iVar23 + uVar6) {
                bVar1 = puVar4[iVar23];
                if (bVar1 == 6) {
                  if ((iVar25 < iVar14) && (iVar19 = iVar25, puVar11[iVar23] != 3))
                  goto LAB_0035c6f9;
                  break;
                }
                if (bVar1 == 0) goto LAB_0035d8eb;
                uVar6 = 1;
                if (bVar1 < 4) {
                  uVar6 = puVar11[iVar23];
                }
              }
              goto LAB_0035d640;
            }
            if (puVar4[Obj] == '\0') goto LAB_0035d8eb;
            goto LAB_0035d640;
          }
LAB_0035d7ab:
          fwrite("\nendmodule\n\n",0xc,1,pFVar13);
        }
        else if (puVar4[iVar15] == '\0') goto LAB_0035d8eb;
        if (p_00->pHead[iVar15] == 0) {
LAB_0035d8eb:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        uVar6 = 1;
        if (p_00->pHead[iVar15] < 4) {
          uVar6 = p_00->pBody[iVar15];
        }
        iVar15 = iVar15 + uVar6;
        puVar11 = p_00->pBody;
      } while (iVar15 < (int)*puVar11);
    }
  }
  pFVar13 = fopen("test.ndr","wb");
  if (pFVar13 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n","test.ndr");
  }
  else {
    fwrite(p_00->pBody,4,(ulong)*p_00->pBody,pFVar13);
    fwrite(p_00->pHead,1,(ulong)*p_00->pBody,pFVar13);
    fclose(pFVar13);
  }
  if (p_00 != (Ndr_Data_t *)0x0) {
    free(p_00->pHead);
    free(p_00->pBody);
    free(p_00);
  }
  if (1 < (p->vTypes).nSize) {
    lVar17 = 1;
    do {
      pvVar10 = *(void **)((long)__ptr + lVar17 * 8);
      if (pvVar10 != (void *)0x0) {
        free(pvVar10);
        *(undefined8 *)((long)__ptr + lVar17 * 8) = 0;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (p->vTypes).nSize);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar22 = 1;
    if (bVar1 < 4) {
      uVar22 = puVar11[iVar18];
    }
    iVar18 = iVar18 + uVar22;
    if (iVar25 <= iVar18) break;
LAB_0035c4d0:
    bVar1 = puVar4[iVar18];
    if (bVar1 == 6) {
      if (puVar11[iVar18] != 4) {
        if ((int)uVar6 < 1) goto LAB_0035c57c;
        uVar24 = 0;
        goto LAB_0035c516;
      }
      break;
    }
  }
  goto LAB_0035c614;
  while (uVar24 = uVar24 + 1, uVar24 != uVar6) {
LAB_0035c516:
    uVar22 = 0xffffffff;
    for (iVar14 = iVar19; iVar14 < iVar25; iVar14 = iVar14 + uVar21) {
      bVar1 = puVar4[iVar14];
      if (bVar1 == 5) {
        uVar22 = puVar11[iVar14];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar21 = 1;
      if (bVar1 < 4) {
        uVar21 = puVar11[iVar14];
      }
    }
    if (*(uint *)((long)pvVar10 + uVar24 * 4) == uVar22) goto LAB_0035c614;
  }
LAB_0035c57c:
  fwrite("  wire ",7,1,pFVar13);
  Ndr_ObjWriteRange(p_00,iVar23,(FILE *)pFVar13,1);
  puVar11 = p_00->pBody;
  lVar17 = -1;
  if (iVar19 < (int)(puVar11[iVar23] + iVar23)) {
    do {
      bVar1 = p_00->pHead[iVar19];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar19];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar22 = 1;
      if (bVar1 < 4) {
        uVar22 = puVar11[iVar19];
      }
      iVar19 = iVar19 + uVar22;
    } while (iVar19 < (int)(puVar11[iVar23] + iVar23));
  }
  fprintf(pFVar13," %s;\n",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035c614:
  if (p_00->pHead[iVar23] == 0) goto LAB_0035d8eb;
  uVar22 = 1;
  if (p_00->pHead[iVar23] < 4) {
    uVar22 = p_00->pBody[iVar23];
  }
  iVar23 = iVar23 + uVar22;
  puVar11 = p_00->pBody;
  if ((int)(puVar11[iVar15] + iVar15) <= iVar23) goto LAB_0035c649;
  goto LAB_0035c455;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar14 <= iVar19) break;
LAB_0035c6f9:
    bVar1 = puVar4[iVar19];
    if (bVar1 == 6) {
      if (puVar11[iVar19] != 4) {
        uVar6 = 0xffffffff;
        iVar23 = iVar25;
        if (iVar25 < iVar14) goto LAB_0035c744;
        goto LAB_0035c778;
      }
      break;
    }
  }
  goto LAB_0035d640;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar22 = 1;
    if (bVar1 < 4) {
      uVar22 = puVar11[iVar23];
    }
    iVar23 = iVar23 + uVar22;
    if (iVar14 <= iVar23) break;
LAB_0035c744:
    bVar1 = puVar4[iVar23];
    if (bVar1 == 6) {
      uVar6 = puVar11[iVar23];
      break;
    }
  }
LAB_0035c778:
  if ((int)uVar6 < 0x100) {
    switch(uVar6) {
    case 0x50:
      fprintf(pFVar13,"  %s ","ABC_READ");
      puVar11 = p_00->pBody;
      iVar23 = puVar11[Obj] + Obj;
      if (iVar25 < iVar23) {
        iVar14 = iVar25;
        do {
          bVar1 = p_00->pHead[iVar14];
          if (bVar1 == 7) {
            iVar19 = iVar25;
            if (0 < (int)puVar11[iVar14]) goto LAB_0035cc46;
            break;
          }
          if (bVar1 == 0) goto LAB_0035d8eb;
          uVar6 = 1;
          if (bVar1 < 4) {
            uVar6 = puVar11[iVar14];
          }
          iVar14 = iVar14 + uVar6;
        } while (iVar14 < iVar23);
      }
      goto LAB_0035d1fc;
    case 0x51:
      fprintf(pFVar13,"  %s ","ABC_WRITE");
      puVar11 = p_00->pBody;
      iVar23 = puVar11[Obj] + Obj;
      if (iVar25 < iVar23) {
        iVar14 = iVar25;
        do {
          bVar1 = p_00->pHead[iVar14];
          if (bVar1 == 7) {
            iVar19 = iVar25;
            if (0 < (int)puVar11[iVar14]) goto LAB_0035cc91;
            break;
          }
          if (bVar1 == 0) goto LAB_0035d8eb;
          uVar6 = 1;
          if (bVar1 < 4) {
            uVar6 = puVar11[iVar14];
          }
          iVar14 = iVar14 + uVar6;
        } while (iVar14 < iVar23);
      }
      goto LAB_0035d32b;
    case 0x58:
      fprintf(pFVar13,"  %s ","ABC_DFF");
      puVar11 = p_00->pBody;
      iVar23 = puVar11[Obj] + Obj;
      if (iVar25 < iVar23) {
        iVar14 = iVar25;
        do {
          bVar1 = p_00->pHead[iVar14];
          if (bVar1 == 7) {
            iVar19 = iVar25;
            if (0 < (int)puVar11[iVar14]) goto LAB_0035cbfb;
            break;
          }
          if (bVar1 == 0) goto LAB_0035d8eb;
          uVar6 = 1;
          if (bVar1 < 4) {
            uVar6 = puVar11[iVar14];
          }
          iVar14 = iVar14 + uVar6;
        } while (iVar14 < iVar23);
      }
      goto LAB_0035d0db;
    case 0x59:
      fprintf(pFVar13,"  %s ","ABC_DFFRSE");
      puVar11 = p_00->pBody;
      iVar23 = puVar11[Obj] + Obj;
      if (iVar25 < iVar23) {
        iVar14 = iVar25;
        do {
          bVar1 = p_00->pHead[iVar14];
          if (bVar1 == 7) {
            iVar19 = iVar25;
            if (0 < (int)puVar11[iVar14]) goto LAB_0035ccdc;
            break;
          }
          if (bVar1 == 0) goto LAB_0035d8eb;
          uVar6 = 1;
          if (bVar1 < 4) {
            uVar6 = puVar11[iVar14];
          }
          iVar14 = iVar14 + uVar6;
        } while (iVar14 < iVar23);
      }
      goto LAB_0035d473;
    }
    lVar17 = -1;
    for (iVar23 = iVar25; iVar23 < iVar14; iVar23 = iVar23 + uVar22) {
      bVar1 = puVar4[iVar23];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar23];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar22 = 1;
      if (bVar1 < 4) {
        uVar22 = puVar11[iVar23];
      }
    }
    uVar22 = 0;
    fprintf(pFVar13,"  assign %s = ",*(undefined8 *)((long)__ptr + lVar17 * 8));
    puVar11 = p_00->pBody;
    iVar23 = puVar11[Obj] + Obj;
    if (iVar25 < iVar23) {
      puVar12 = (uint *)0x0;
      uVar22 = 0;
      iVar14 = iVar25;
      do {
        bVar1 = p_00->pHead[iVar14];
        if (bVar1 == 4) {
          uVar22 = uVar22 + 1;
          if (puVar12 == (uint *)0x0) {
            puVar12 = puVar11 + iVar14;
          }
        }
        else {
          if (bVar1 == 0) goto LAB_0035d8eb;
          if (puVar12 != (uint *)0x0) break;
        }
        uVar21 = 1;
        if (bVar1 < 4) {
          uVar21 = puVar11[iVar14];
        }
        iVar14 = iVar14 + uVar21;
      } while (iVar14 < iVar23);
    }
    else {
      puVar12 = (uint *)0x0;
    }
    if (uVar22 == 0) {
      if (iVar25 < iVar23) {
        do {
          bVar1 = p_00->pHead[iVar25];
          if (bVar1 == 9) {
            puVar11 = puVar11 + iVar25;
            goto LAB_0035d030;
          }
          if (bVar1 == 0) goto LAB_0035d8eb;
          uVar6 = 1;
          if (bVar1 < 4) {
            uVar6 = puVar11[iVar25];
          }
          iVar25 = iVar25 + uVar6;
        } while (iVar25 < iVar23);
        puVar11 = (uint *)0x0;
      }
      else {
        puVar11 = (uint *)0x0;
      }
LAB_0035d030:
      fprintf(pFVar13,"%s;\n",puVar11);
      goto LAB_0035d640;
    }
    if (uVar22 == 1 && iVar25 < iVar23) {
      iVar14 = iVar25;
      do {
        bVar1 = p_00->pHead[iVar14];
        if (bVar1 == 6) {
          if (puVar11[iVar14] == 0xb) {
            fprintf(pFVar13,"%s;\n",*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
            goto LAB_0035d640;
          }
          break;
        }
        if (bVar1 == 0) goto LAB_0035d8eb;
        uVar21 = 1;
        if (bVar1 < 4) {
          uVar21 = puVar11[iVar14];
        }
        iVar14 = iVar14 + uVar21;
      } while (iVar14 < iVar23);
    }
    if (uVar6 == 0x5c) {
      fputc(0x7b,pFVar13);
      if (0 < (int)uVar22) {
        uVar24 = 0;
        do {
          pcVar7 = "    \"%s\", ";
          if (uVar22 - 1 == uVar24) {
            pcVar7 = "T = %d\t\t";
          }
          fprintf(pFVar13,"%s%s",*(undefined8 *)((long)__ptr + (long)(int)puVar12[uVar24] * 8),
                  pcVar7 + 8);
          uVar24 = uVar24 + 1;
        } while (uVar22 != uVar24);
      }
      fwrite("};\n",3,1,pFVar13);
      goto LAB_0035d640;
    }
    if (uVar6 != 0x5b) {
      if (uVar22 == 1) {
        uVar6 = 0xffffffff;
        if (iVar25 < iVar23) {
          do {
            bVar1 = p_00->pHead[iVar25];
            if (bVar1 == 6) {
              uVar6 = puVar11[iVar25];
              break;
            }
            if (bVar1 == 0) goto LAB_0035d8eb;
            uVar22 = 1;
            if (bVar1 < 4) {
              uVar22 = puVar11[iVar25];
            }
            iVar25 = iVar25 + uVar22;
          } while (iVar25 < iVar23);
        }
        pcVar7 = Abc_OperName(uVar6);
        fprintf(pFVar13,"%s %s;\n",pcVar7,*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
      }
      else {
        if (uVar22 == 2) {
          uVar16 = *(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8);
          iVar23 = Ndr_ObjReadBody(p_00,Obj,6);
          pcVar7 = Abc_OperName(iVar23);
          uVar20 = *(undefined8 *)((long)__ptr + (long)(int)puVar12[1] * 8);
          pcVar9 = "%s %s %s;\n";
        }
        else if (uVar6 == 0x32 && uVar22 == 3) {
          uVar16 = *(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8);
          pcVar7 = *(char **)((long)__ptr + (long)(int)puVar12[1] * 8);
          uVar20 = *(undefined8 *)((long)__ptr + (long)(int)puVar12[2] * 8);
          pcVar9 = "%s + %s + %s;\n";
        }
        else {
          if (uVar6 != 0x15) {
            iVar23 = Ndr_ObjReadBody(p_00,Obj,6);
            pcVar7 = Abc_OperName(iVar23);
            fprintf(pFVar13,"<cannot write operation %s>;\n",pcVar7);
            goto LAB_0035d640;
          }
          uVar16 = *(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8);
          pcVar7 = *(char **)((long)__ptr + (long)(int)puVar12[1] * 8);
          uVar20 = *(undefined8 *)((long)__ptr + (long)(int)puVar12[2] * 8);
          pcVar9 = "%s ? %s : %s;\n";
        }
        fprintf(pFVar13,pcVar9,uVar16,pcVar7,uVar20);
      }
      goto LAB_0035d640;
    }
    fputs(*(char **)((long)__ptr + (long)(int)*puVar12 * 8),pFVar13);
    puVar11 = p_00->pBody;
    if (iVar25 < (int)(puVar11[Obj] + Obj)) {
      puVar12 = (uint *)0x0;
      iVar23 = 0;
      do {
        bVar1 = p_00->pHead[iVar25];
        if (bVar1 == 8) {
          iVar23 = iVar23 + 1;
          if (puVar12 == (uint *)0x0) {
            puVar12 = puVar11 + iVar25;
          }
        }
        else {
          if (bVar1 == 0) goto LAB_0035d8eb;
          if (puVar12 != (uint *)0x0) break;
        }
        uVar6 = 1;
        if (bVar1 < 4) {
          uVar6 = puVar11[iVar25];
        }
        iVar25 = iVar25 + uVar6;
      } while (iVar25 < (int)(puVar11[Obj] + Obj));
    }
    else {
      puVar12 = (uint *)0x0;
      iVar23 = 0;
    }
    if (iVar23 == 0) {
      uVar6 = 0;
LAB_0035d68b:
      fprintf(pFVar13,"[%d]",(ulong)uVar6);
    }
    else {
      if (iVar23 == 1) {
        uVar6 = *puVar12;
        goto LAB_0035d68b;
      }
      fprintf(pFVar13,"[%d:%d]",(ulong)*puVar12,(ulong)puVar12[1]);
    }
    fwrite(";\n",2,1,pFVar13);
    goto LAB_0035d640;
  }
  lVar17 = -1;
  for (iVar23 = uVar6 - 0xff; iVar23 < (int)(uVar6 + puVar11[(long)(int)uVar6 + -0x100] + -0x100);
      iVar23 = iVar23 + uVar22) {
    bVar1 = puVar4[iVar23];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar23];
      break;
    }
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar22 = 1;
    if (bVar1 < 4) {
      uVar22 = puVar11[iVar23];
    }
  }
  fprintf(pFVar13,"  %s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
  puVar11 = p_00->pBody;
  iVar23 = puVar11[Obj] + Obj;
  if (iVar25 < iVar23) {
    iVar14 = iVar25;
    do {
      bVar1 = p_00->pHead[iVar14];
      if (bVar1 == 7) {
        iVar19 = iVar25;
        if (0 < (int)puVar11[iVar14]) goto LAB_0035c8de;
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar14];
      }
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar23);
  }
  goto LAB_0035caca;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar23 <= iVar19) break;
LAB_0035ccdc:
    bVar1 = p_00->pHead[iVar19];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar19];
      goto LAB_0035d45c;
    }
  }
  lVar17 = -1;
LAB_0035d45c:
  fprintf(pFVar13,"%s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035d473:
  fwrite("( ",2,1,pFVar13);
  puVar11 = p_00->pBody;
  iVar23 = puVar11[Obj] + Obj;
  if (iVar25 < iVar23) {
    puVar12 = (uint *)0x0;
    iVar14 = iVar25;
    do {
      bVar1 = p_00->pHead[iVar14];
      if (bVar1 == 4) {
        if (puVar12 == (uint *)0x0) {
          puVar12 = puVar11 + iVar14;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035d8eb;
        if (puVar12 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar14];
      }
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar23);
  }
  else {
    puVar12 = (uint *)0x0;
  }
  lVar17 = -1;
  if (iVar25 < iVar23) {
    do {
      bVar1 = p_00->pHead[iVar25];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar25];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar25];
      }
      iVar25 = iVar25 + uVar6;
    } while (iVar25 < iVar23);
  }
  fprintf(pFVar13,".q(%s), ",*(undefined8 *)((long)__ptr + lVar17 * 8));
  fprintf(pFVar13,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
  fprintf(pFVar13,".clk(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[1] * 8));
  fprintf(pFVar13,".reset(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[2] * 8));
  fprintf(pFVar13,".set(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[3] * 8));
  fprintf(pFVar13,".enable(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[4] * 8));
  fprintf(pFVar13,".async(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[5] * 8));
  fprintf(pFVar13,".sre(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[6] * 8));
  uVar6 = puVar12[7];
  goto LAB_0035d60a;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar23 <= iVar19) break;
LAB_0035cbfb:
    bVar1 = p_00->pHead[iVar19];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar19];
      goto LAB_0035d0c4;
    }
  }
  lVar17 = -1;
LAB_0035d0c4:
  fprintf(pFVar13,"%s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035d0db:
  fwrite("( ",2,1,pFVar13);
  puVar11 = p_00->pBody;
  iVar23 = puVar11[Obj] + Obj;
  if (iVar25 < iVar23) {
    puVar12 = (uint *)0x0;
    iVar14 = iVar25;
    do {
      bVar1 = p_00->pHead[iVar14];
      if (bVar1 == 4) {
        if (puVar12 == (uint *)0x0) {
          puVar12 = puVar11 + iVar14;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035d8eb;
        if (puVar12 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar14];
      }
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar23);
  }
  else {
    puVar12 = (uint *)0x0;
  }
  lVar17 = -1;
  if (iVar25 < iVar23) {
    do {
      bVar1 = p_00->pHead[iVar25];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar25];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar25];
      }
      iVar25 = iVar25 + uVar6;
    } while (iVar25 < iVar23);
  }
  fprintf(pFVar13,".q(%s), ",*(undefined8 *)((long)__ptr + lVar17 * 8));
  fprintf(pFVar13,".d(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
  uVar6 = puVar12[1];
LAB_0035d60a:
  uVar16 = *(undefined8 *)((long)__ptr + (long)(int)uVar6 * 8);
  pcVar7 = ".init(%s) ";
  goto LAB_0035d618;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar23 <= iVar19) break;
LAB_0035cc91:
    bVar1 = p_00->pHead[iVar19];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar19];
      goto LAB_0035d314;
    }
  }
  lVar17 = -1;
LAB_0035d314:
  fprintf(pFVar13,"%s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035d32b:
  fwrite("( ",2,1,pFVar13);
  puVar11 = p_00->pBody;
  iVar23 = puVar11[Obj] + Obj;
  if (iVar25 < iVar23) {
    puVar12 = (uint *)0x0;
    iVar14 = iVar25;
    do {
      bVar1 = p_00->pHead[iVar14];
      if (bVar1 == 4) {
        if (puVar12 == (uint *)0x0) {
          puVar12 = puVar11 + iVar14;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035d8eb;
        if (puVar12 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar14];
      }
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar23);
  }
  else {
    puVar12 = (uint *)0x0;
  }
  lVar17 = -1;
  if (iVar25 < iVar23) {
    do {
      bVar1 = p_00->pHead[iVar25];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar25];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar25];
      }
      iVar25 = iVar25 + uVar6;
    } while (iVar25 < iVar23);
  }
  fprintf(pFVar13,".mem_out(%s), ",*(undefined8 *)((long)__ptr + lVar17 * 8));
  fprintf(pFVar13,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
  fprintf(pFVar13,".addr(%s), ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[1] * 8));
  uVar16 = *(undefined8 *)((long)__ptr + (long)(int)puVar12[2] * 8);
  pcVar7 = ".data(%s) ";
  goto LAB_0035d618;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar23 <= iVar19) break;
LAB_0035cc46:
    bVar1 = p_00->pHead[iVar19];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar19];
      goto LAB_0035d1e5;
    }
  }
  lVar17 = -1;
LAB_0035d1e5:
  fprintf(pFVar13,"%s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035d1fc:
  fwrite("( ",2,1,pFVar13);
  puVar11 = p_00->pBody;
  iVar23 = puVar11[Obj] + Obj;
  if (iVar25 < iVar23) {
    puVar12 = (uint *)0x0;
    iVar14 = iVar25;
    do {
      bVar1 = p_00->pHead[iVar14];
      if (bVar1 == 4) {
        if (puVar12 == (uint *)0x0) {
          puVar12 = puVar11 + iVar14;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035d8eb;
        if (puVar12 != (uint *)0x0) break;
      }
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar14];
      }
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar23);
  }
  else {
    puVar12 = (uint *)0x0;
  }
  lVar17 = -1;
  if (iVar25 < iVar23) {
    do {
      bVar1 = p_00->pHead[iVar25];
      if (bVar1 == 5) {
        lVar17 = (long)(int)puVar11[iVar25];
        break;
      }
      if (bVar1 == 0) goto LAB_0035d8eb;
      uVar6 = 1;
      if (bVar1 < 4) {
        uVar6 = puVar11[iVar25];
      }
      iVar25 = iVar25 + uVar6;
    } while (iVar25 < iVar23);
  }
  fprintf(pFVar13,".data(%s), ",*(undefined8 *)((long)__ptr + lVar17 * 8));
  fprintf(pFVar13,".mem_in(%s), ",*(undefined8 *)((long)__ptr + (long)(int)*puVar12 * 8));
  uVar16 = *(undefined8 *)((long)__ptr + (long)(int)puVar12[1] * 8);
  pcVar7 = ".addr(%s) ";
LAB_0035d618:
  fprintf(pFVar13,pcVar7,uVar16);
  fwrite(");\n",3,1,pFVar13);
LAB_0035d640:
  if (p_00->pHead[Obj] == 0) goto LAB_0035d8eb;
  uVar6 = 1;
  if (p_00->pHead[Obj] < 4) {
    uVar6 = p_00->pBody[Obj];
  }
  Obj = Obj + uVar6;
  puVar11 = p_00->pBody;
  if ((int)(puVar11[iVar15] + iVar15) <= Obj) goto LAB_0035d7ab;
  goto LAB_0035c67b;
  while( true ) {
    if (bVar1 == 0) goto LAB_0035d8eb;
    uVar6 = 1;
    if (bVar1 < 4) {
      uVar6 = puVar11[iVar19];
    }
    iVar19 = iVar19 + uVar6;
    if (iVar23 <= iVar19) break;
LAB_0035c8de:
    bVar1 = p_00->pHead[iVar19];
    if (bVar1 == 7) {
      lVar17 = (long)(int)puVar11[iVar19];
      goto LAB_0035cab3;
    }
  }
  lVar17 = -1;
LAB_0035cab3:
  fprintf(pFVar13,"%s ",*(undefined8 *)((long)__ptr + lVar17 * 8));
LAB_0035caca:
  fwrite("( ",2,1,pFVar13);
  puVar11 = p_00->pBody;
  if (iVar25 < (int)(puVar11[Obj] + Obj)) {
    puVar12 = (uint *)0x0;
    uVar6 = 0;
    do {
      bVar1 = p_00->pHead[iVar25];
      if (bVar1 == 4) {
        uVar6 = uVar6 + 1;
        if (puVar12 == (uint *)0x0) {
          puVar12 = puVar11 + iVar25;
        }
      }
      else {
        if (bVar1 == 0) goto LAB_0035d8eb;
        if (puVar12 != (uint *)0x0) break;
      }
      uVar22 = 1;
      if (bVar1 < 4) {
        uVar22 = puVar11[iVar25];
      }
      iVar25 = iVar25 + uVar22;
    } while (iVar25 < (int)(puVar11[Obj] + Obj));
  }
  else {
    puVar12 = (uint *)0x0;
    uVar6 = 0;
  }
  if (0 < (int)uVar6) {
    uVar24 = 0;
    do {
      pcVar7 = ",";
      if (uVar6 - 1 == uVar24) {
        pcVar7 = "";
      }
      fprintf(pFVar13,"%s%s ",*(undefined8 *)((long)__ptr + (long)(int)puVar12[uVar24] * 8),pcVar7);
      uVar24 = uVar24 + 1;
    } while (uVar6 != uVar24);
  }
  fwrite(");\n",3,1,pFVar13);
  goto LAB_0035d640;
}

Assistant:

void Wln_NtkToNdrTest( Wln_Ntk_t * p )
{
    // transform
    void * pDesign = Wln_NtkToNdr( p );

    // collect names     
    char ** ppNames = ABC_ALLOC( char *, Wln_NtkObjNum(p) + 1 ); int i;
    Wln_NtkForEachObj( p, i ) 
        ppNames[i] = Abc_UtilStrsav(Wln_ObjName(p, i));

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    Wln_NtkForEachObj( p, i ) 
        ABC_FREE( ppNames[i] );
    ABC_FREE( ppNames );
}